

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

bool __thiscall soul::Value::operator==(Value *this,Value *other)

{
  bool bVar1;
  PackedData PStack_48;
  PackedData local_30;
  
  if ((this->type).category == invalid) {
    bVar1 = (other->type).category == invalid;
  }
  else {
    bVar1 = Type::isIdentical(&this->type,&other->type);
    if (bVar1) {
      getData(&local_30,this);
      getData(&PStack_48,other);
      bVar1 = PackedData::equals(&local_30,&PStack_48);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool Value::operator== (const Value& other) const
{
    if (! type.isValid())
        return ! other.type.isValid();

    return type.isIdentical (other.type) && getData().equals (other.getData());
}